

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_NewStackScFunc<Js::OpLayoutT_ElementSlotI1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementSlotI1<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout)

{
  ushort uVar1;
  unsigned_short localRegisterID;
  FrameDisplay *environment;
  FunctionInfoPtrPtr infoRef;
  StackScriptFunction *stackFunction;
  ScriptFunction *value;
  FrameDisplay *frameDisplay;
  uint funcIndex;
  OpLayoutT_ElementSlotI1<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout_local;
  InterpreterStackFrame *this_local;
  
  uVar1 = playout->SlotIndex;
  environment = GetFrameDisplayForNestedFunc(this);
  localRegisterID = playout->Value;
  infoRef = ParseableFunctionInfo::GetNestedFuncReference
                      (*(ParseableFunctionInfo **)(this + 0x88),(uint)uVar1);
  stackFunction = GetStackNestedFunction(this,(uint)uVar1);
  value = StackScriptFunction::OP_NewStackScFunc
                    (environment,infoRef,&stackFunction->super_ScriptFunction);
  SetRegAllowStackVarEnableOnly<unsigned_short>(this,localRegisterID,value);
  return;
}

Assistant:

void InterpreterStackFrame::OP_NewStackScFunc(const unaligned T * playout)
    {
        uint funcIndex = playout->SlotIndex;
        FrameDisplay *frameDisplay = this->GetFrameDisplayForNestedFunc();
        SetRegAllowStackVarEnableOnly(playout->Value,
            StackScriptFunction::OP_NewStackScFunc(frameDisplay,
                this->m_functionBody->GetNestedFuncReference(funcIndex),
                this->GetStackNestedFunction(funcIndex)));
    }